

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_sqrt_riscv32(float128 a,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  float128 b;
  uint32_t uVar1;
  uint64_t uVar2;
  float128 fVar3;
  uint64_t local_b0;
  uint64_t term3;
  uint64_t term2;
  uint64_t term1;
  uint64_t term0;
  uint64_t rem3;
  uint64_t rem2;
  uint64_t rem1;
  uint64_t rem0;
  uint64_t doubleZSig0;
  uint64_t zSig2;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  uint local_38;
  int32_t zExp;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  uint64_t local_10;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  zSig0 = extractFloat128Frac1(a);
  fVar3.high = a_local.low;
  fVar3.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(fVar3);
  a_00.high = a_local.low;
  a_00.low = (uint64_t)status_local;
  local_38 = extractFloat128Exp(a_00);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  zExp._3_1_ = extractFloat128Sign(a_01);
  if (local_38 == 0x7fff) {
    if (aSig1 != 0 || zSig0 != 0) {
      a_02.high = a_local.low;
      a_02.low = (uint64_t)status_local;
      b.high = a_local.low;
      b.low = (uint64_t)status_local;
      fVar3 = propagateFloat128NaN(a_02,b,_aExp);
      return fVar3;
    }
    if (zExp._3_1_ == '\0') {
      local_10 = a_local.low;
      a_local.high = (uint64_t)status_local;
      return stack0xffffffffffffffe8;
    }
  }
  else {
    if (zExp._3_1_ == '\0') {
      if (local_38 == 0) {
        if (aSig1 == 0 && zSig0 == 0) {
          fVar3 = packFloat128('\0',0,0,0);
          return fVar3;
        }
        normalizeFloat128Subnormal(aSig1,zSig0,(int32_t *)&local_38,&aSig1,&zSig0);
      }
      aSig0._4_4_ = ((int)(local_38 - 0x3fff) >> 1) + 0x3ffe;
      aSig1 = aSig1 | 0x1000000000000;
      uVar1 = estimateSqrt32(local_38,(uint32_t)(aSig1 >> 0x11));
      zSig1 = (uint64_t)uVar1;
      shortShift128Left(aSig1,zSig0,0xd - (local_38 & 1),&aSig1,&zSig0);
      uVar2 = estimateDiv128To64(aSig1,zSig0,zSig1 << 0x20);
      zSig1 = uVar2 + zSig1 * 0x40000000;
      rem0 = zSig1 * 2;
      mul64To128(zSig1,zSig1,&term1,&term2);
      sub128(aSig1,zSig0,term1,term2,&rem1,&rem2);
      while ((long)rem1 < 0) {
        zSig1 = zSig1 - 1;
        rem0 = rem0 - 2;
        add128(rem1,rem2,zSig1 >> 0x3f,rem0 | 1,&rem1,&rem2);
      }
      zSig2 = estimateDiv128To64(rem2,0,rem0);
      if ((zSig2 & 0x1fff) < 6) {
        if (zSig2 == 0) {
          zSig2 = 1;
        }
        mul64To128(rem0,zSig2,&term2,&term3);
        sub128(rem2,0,term2,term3,&rem2,&rem3);
        mul64To128(zSig2,zSig2,&term3,&local_b0);
        sub192(rem2,rem3,0,0,term3,local_b0,&rem2,&rem3,&term0);
        while ((long)rem2 < 0) {
          zSig2 = zSig2 - 1;
          shortShift128Left(0,zSig2,1,&term3,&local_b0);
          local_b0 = local_b0 | 1;
          term3 = rem0 | term3;
          add192(rem2,rem3,term0,0,term3,local_b0,&rem2,&rem3,&term0);
        }
        zSig2 = (long)(int)(uint)((rem2 != 0 || rem3 != 0) || term0 != 0) | zSig2;
      }
      shift128ExtraRightJamming(zSig1,zSig2,0,0xe,&zSig1,&zSig2,&doubleZSig0);
      fVar3 = roundAndPackFloat128('\0',aSig0._4_4_,zSig1,zSig2,doubleZSig0,_aExp);
      return fVar3;
    }
    if ((local_38 == 0 && aSig1 == 0) && zSig0 == 0) {
      local_10 = a_local.low;
      a_local.high = (uint64_t)status_local;
      return stack0xffffffffffffffe8;
    }
  }
  float_raise_riscv32('\x01',_aExp);
  fVar3 = float128_default_nan_riscv32(_aExp);
  return fVar3;
}

Assistant:

float128 float128_sqrt(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, zSig2, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( 0, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFE;
    aSig0 |= UINT64_C(0x0001000000000000);
    zSig0 = estimateSqrt32( aExp, aSig0>>17 );
    shortShift128Left( aSig0, aSig1, 13 - ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & 0x1FFF ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 14, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(0, zExp, zSig0, zSig1, zSig2, status);

}